

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O0

void __thiscall
soul::
ArrayWithPreallocation<soul::ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>,_16UL>
::reserve(ArrayWithPreallocation<soul::ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>,_16UL>
          *this,size_t minSize)

{
  unsigned_long uVar1;
  void *pvVar2;
  ulong local_28;
  size_t i;
  ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *newObjects;
  size_t minSize_local;
  ArrayWithPreallocation<soul::ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>,_16UL>
  *this_local;
  
  if (*(ulong *)(this + 0x10) < minSize) {
    uVar1 = getAlignedSize<16,unsigned_long>(minSize);
    if (0x10 < uVar1) {
      pvVar2 = operator_new__(uVar1 * 0x118);
      for (local_28 = 0; local_28 < *(ulong *)(this + 8); local_28 = local_28 + 1) {
        ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::ArrayWithPreallocation
                  ((ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                    *)((long)pvVar2 + local_28 * 0x118),
                   (ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                    *)(*(long *)this + local_28 * 0x118));
        ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::~ArrayWithPreallocation
                  ((ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                    *)(*(long *)this + local_28 * 0x118));
      }
      freeIfHeapAllocated(this);
      *(void **)this = pvVar2;
    }
    *(unsigned_long *)(this + 0x10) = uVar1;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }